

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConstructSymbolTableVisitor.cpp
# Opt level: O0

void __thiscall
CConstructSymbolTableVisitor::Visit(CConstructSymbolTableVisitor *this,CWhileStm *stm)

{
  bool bVar1;
  pointer pIVar2;
  pointer pIVar3;
  CWhileStm *stm_local;
  CConstructSymbolTableVisitor *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->conditionExpression);
  if (bVar1) {
    pIVar2 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                       (&stm->conditionExpression);
    (**(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->statement);
  if (bVar1) {
    pIVar3 = std::unique_ptr<IStatement,_std::default_delete<IStatement>_>::operator->
                       (&stm->statement);
    (**(pIVar3->super_PositionedNode).super_INode._vptr_INode)(pIVar3,this);
  }
  return;
}

Assistant:

void CConstructSymbolTableVisitor::Visit( CWhileStm &stm )
{
	if( stm.conditionExpression ) {
		stm.conditionExpression->Accept( *this );
	}
	if( stm.statement ) {
		stm.statement->Accept( *this );
	}
}